

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O3

Error __thiscall asmjit::CodeEmitter::commentv(CodeEmitter *this,char *fmt,__va_list_tag *ap)

{
  Error EVar1;
  
  EVar1 = this->_lastError;
  if ((EVar1 == 0) && (EVar1 = 0, (this->_globalOptions & 4) != 0)) {
    EVar1 = Logger::logv(this->_code->_logger,fmt,ap);
    return EVar1;
  }
  return EVar1;
}

Assistant:

Error CodeEmitter::commentv(const char* fmt, va_list ap) {
  Error err = _lastError;
  if (err) return err;

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    err = _code->_logger->logv(fmt, ap);
#else
  ASMJIT_UNUSED(fmt);
  ASMJIT_UNUSED(ap);
#endif

  return err;
}